

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

void blend_tiled_generic_rgb64(int count,QT_FT_Span *spans,void *userData)

{
  uint uVar1;
  uint uVar2;
  BPP BVar3;
  char cVar4;
  QRgba64 *pQVar5;
  undefined4 *puVar6;
  QThreadPool *pQVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  long in_FS_OFFSET;
  QSemaphore semaphore;
  Operator op;
  QRgba64 src_buffer [2048];
  QT_FT_Span *local_4158;
  undefined1 *local_40f0;
  Operator local_40e8;
  undefined1 local_4038 [28];
  uint uStack_401c;
  QSpanData *local_4018;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&local_40e8,&DAT_006ce8d0,0xb0);
  getOperator(&local_40e8,(QSpanData *)userData,spans,count);
  if (local_40e8.func64 == (CompositionFunction64)0x0) {
    lcQtGuiDrawHelper();
    if (((byte)lcQtGuiDrawHelper::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
        0) {
      local_4038._0_4_ = 2;
      local_4038._4_4_ = 0;
      local_4038._8_4_ = 0;
      local_4038._12_4_ = 0;
      local_4038._16_4_ = 0;
      local_4038._20_4_ = 0;
      stack0xffffffffffffbfe0 = lcQtGuiDrawHelper::category.name;
      QMessageLogger::debug
                (local_4038,
                 "blend_tiled_generic_rgb64: unsupported 64-bit blend attempted, falling back to 32-bit"
                );
    }
    blend_tiled_generic(count,spans,userData);
  }
  else {
    uVar1 = *(uint *)((long)userData + 0xb0);
    lVar15 = (long)(int)uVar1;
    uVar2 = *(uint *)((long)userData + 0xb4);
    iVar10 = (int)((double)((ulong)-*(double *)((long)userData + 0x70) & 0x8000000000000000 |
                           0x3fe0000000000000) - *(double *)((long)userData + 0x70)) % (int)uVar1;
    iVar12 = (int)((double)((ulong)-*(double *)((long)userData + 0x78) & 0x8000000000000000 |
                           0x3fe0000000000000) - *(double *)((long)userData + 0x78)) % (int)uVar2;
    uVar16 = 0;
    if (0 < iVar10) {
      uVar16 = uVar1;
    }
    iVar10 = uVar16 - iVar10;
    uVar16 = 0;
    if (0 < iVar12) {
      uVar16 = uVar2;
    }
    iVar12 = uVar16 - iVar12;
    if (((lVar15 < 0x801) && (local_40e8.destFetch64 == destFetch64Undefined)) &&
       (BVar3 = qPixelLayouts[*(uint *)(*userData + 0x10)].bpp, (BVar3 & ~BPP1MSB) == BPP32)) {
      if (count != 0) {
        local_4158 = spans;
        do {
          iVar17 = local_4158->x;
          iVar14 = local_4158->y;
          uVar16 = local_4158->len;
          iVar11 = (iVar10 + iVar17) % (int)uVar1;
          iVar13 = (iVar12 + iVar14) % (int)uVar2;
          uVar19 = iVar11 >> 0x1f & uVar1;
          iVar13 = (iVar13 >> 0x1f & uVar2) + iVar13;
          uVar18 = uVar16;
          if ((int)uVar1 < (int)uVar16) {
            uVar18 = uVar1;
          }
          iVar20 = uVar19 + iVar11;
          if ((iVar20 != 0 && SCARRY4(uVar19,iVar11) == iVar20 < 0) && (0 < (int)uVar18)) {
            uVar19 = uVar1 - iVar20;
            if ((int)uVar18 <= (int)(uVar1 - iVar20)) {
              uVar19 = uVar18;
            }
            pQVar5 = (*local_40e8.srcFetch64)
                               ((QRgba64 *)local_4038,&local_40e8,(QSpanData *)userData,iVar13,
                                iVar20,uVar19);
            (*local_40e8.destStore64)(*userData,iVar17,iVar14,pQVar5,uVar19);
            iVar17 = iVar17 + uVar19;
            iVar20 = iVar20 + uVar19;
            uVar18 = uVar18 - uVar19;
            if ((int)uVar1 <= iVar20) {
              iVar20 = 0;
            }
          }
          if (0 < (int)uVar18) {
            pQVar5 = (*local_40e8.srcFetch64)
                               ((QRgba64 *)local_4038,&local_40e8,(QSpanData *)userData,iVar13,
                                iVar20,uVar18);
            (*local_40e8.destStore64)(*userData,iVar17,iVar14,pQVar5,uVar18);
            iVar17 = iVar17 + uVar18;
          }
          lVar21 = (long)iVar14 * *(long *)(*userData + 0x28) + *(long *)(*userData + 0x38);
          if (BVar3 == BPP32) {
            if ((int)uVar1 < (int)uVar16) {
              puVar6 = (undefined4 *)(lVar21 + (long)iVar17 * 4);
              lVar21 = (long)(int)uVar16 + -lVar15;
              do {
                *puVar6 = puVar6[-lVar15];
                puVar6 = puVar6 + 1;
                lVar21 = lVar21 + -1;
              } while (lVar21 != 0);
            }
          }
          else if ((int)uVar1 < (int)uVar16) {
            puVar8 = (undefined8 *)(lVar21 + (long)iVar17 * 8);
            lVar21 = (long)(int)uVar16 + -lVar15;
            do {
              *puVar8 = puVar8[-lVar15];
              puVar8 = puVar8 + 1;
              lVar21 = lVar21 + -1;
            } while (lVar21 != 0);
          }
          count = count + -1;
          local_4158 = local_4158 + 1;
        } while (count != 0);
      }
    }
    else {
      stack0xffffffffffffbfe0 = (char *)CONCAT44(uVar2,iVar12);
      iVar12 = count + 0x5f;
      if (-1 < count + 0x20) {
        iVar12 = count + 0x20;
      }
      local_4038._16_4_ = iVar10;
      local_4038._20_4_ = uVar1;
      local_4018 = (QSpanData *)userData;
      local_4038._0_8_ = &local_40e8;
      local_4038._8_8_ = spans;
      pQVar7 = QGuiApplicationPrivate::qtGuiThreadPool();
      if (((0x5f < count) && (pQVar7 != (QThreadPool *)0x0)) &&
         (2 < (int)qPixelLayouts[*(uint *)(*userData + 0x10)].bpp)) {
        QThread::currentThread();
        cVar4 = QThreadPool::contains((QThread *)pQVar7);
        if (cVar4 == '\0') {
          iVar12 = iVar12 >> 6;
          local_40f0 = &DAT_aaaaaaaaaaaaaaaa;
          iVar17 = 0;
          QSemaphore::QSemaphore((QSemaphore *)&local_40f0,0);
          iVar10 = 1;
          if (1 < iVar12) {
            iVar10 = iVar12;
          }
          iVar14 = 0;
          do {
            iVar11 = (count - iVar14) / (iVar12 + iVar17);
            puVar8 = (undefined8 *)operator_new(0x18);
            *(undefined1 *)(puVar8 + 1) = 1;
            *puVar8 = QFactoryLoader::keyMap;
            puVar9 = (undefined8 *)operator_new(0x20);
            *puVar9 = QRunnable::QGenericRunnable::
                      Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4839:5)>
                      ::impl;
            *(int *)(puVar9 + 1) = iVar14;
            *(int *)((long)puVar9 + 0xc) = iVar11;
            puVar9[2] = local_4038;
            puVar9[3] = &local_40f0;
            puVar8[2] = puVar9;
            QThreadPool::start((QRunnable *)pQVar7,(int)puVar8);
            iVar14 = iVar14 + iVar11;
            iVar17 = iVar17 + -1;
          } while (-iVar10 != iVar17);
          QSemaphore::acquire((int)(QSemaphore *)&local_40f0);
          QSemaphore::~QSemaphore((QSemaphore *)&local_40f0);
          goto LAB_0066de75;
        }
      }
      blend_tiled_generic_rgb64::anon_class_40_7_bfeee2df::operator()
                ((anon_class_40_7_bfeee2df *)local_4038,0,count);
    }
  }
LAB_0066de75:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void blend_tiled_generic_rgb64(int count, const QT_FT_Span *spans, void *userData)
{
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);

    const Operator op = getOperator(data, spans, count);
    if (!op.func64) {
        qCDebug(lcQtGuiDrawHelper, "blend_tiled_generic_rgb64: unsupported 64-bit blend attempted, falling back to 32-bit");
        return blend_tiled_generic(count, spans, userData);
    }

    const int image_width = data->texture.width;
    const int image_height = data->texture.height;
    int xoff = -qRound(-data->dx) % image_width;
    int yoff = -qRound(-data->dy) % image_height;

    if (xoff < 0)
        xoff += image_width;
    if (yoff < 0)
        yoff += image_height;

    bool isBpp32 = qPixelLayouts[data->rasterBuffer->format].bpp == QPixelLayout::BPP32;
    bool isBpp64 = qPixelLayouts[data->rasterBuffer->format].bpp == QPixelLayout::BPP64;
    if (op.destFetch64 == destFetch64Undefined && image_width <= BufferSize && (isBpp32 || isBpp64)) {
        alignas(16) Q_DECL_UNINITIALIZED QRgba64 src_buffer[BufferSize];
        // If destination isn't blended into the result, we can do the tiling directly on destination pixels.
        while (count--) {
            int x = spans->x;
            int y = spans->y;
            int length = spans->len;
            int sx = (xoff + spans->x) % image_width;
            int sy = (spans->y + yoff) % image_height;
            if (sx < 0)
                sx += image_width;
            if (sy < 0)
                sy += image_height;

            int sl = qMin(image_width, length);
            if (sx > 0 && sl > 0) {
                int l = qMin(image_width - sx, sl);
                const QRgba64 *src = op.srcFetch64(src_buffer, &op, data, sy, sx, l);
                op.destStore64(data->rasterBuffer, x, y, src, l);
                x += l;
                sx += l;
                sl -= l;
                if (sx >= image_width)
                    sx = 0;
            }
            if (sl > 0) {
                Q_ASSERT(sx == 0);
                const QRgba64 *src = op.srcFetch64(src_buffer, &op, data, sy, sx, sl);
                op.destStore64(data->rasterBuffer, x, y, src, sl);
                x += sl;
                sx += sl;
                sl -= sl;
                if (sx >= image_width)
                    sx = 0;
            }
            if (isBpp32) {
                uint *dest = reinterpret_cast<uint *>(data->rasterBuffer->scanLine(y)) + x - image_width;
                for (int i = image_width; i < length; ++i)
                    dest[i] = dest[i - image_width];
            } else {
                quint64 *dest = reinterpret_cast<quint64 *>(data->rasterBuffer->scanLine(y)) + x - image_width;
                for (int i = image_width; i < length; ++i)
                    dest[i] = dest[i - image_width];
            }
            ++spans;
        }
        return;
    }

    auto function = [=, &op](int cStart, int cEnd)
    {
        alignas(16) Q_DECL_UNINITIALIZED QRgba64 buffer[BufferSize];
        alignas(16) Q_DECL_UNINITIALIZED QRgba64 src_buffer[BufferSize];
        for (int c = cStart; c < cEnd; ++c) {
            int x = spans[c].x;
            int length = spans[c].len;
            int sx = (xoff + spans[c].x) % image_width;
            int sy = (spans[c].y + yoff) % image_height;
            if (sx < 0)
                sx += image_width;
            if (sy < 0)
                sy += image_height;

            const int coverage = (spans[c].coverage * data->texture.const_alpha) >> 8;
            while (length) {
                int l = qMin(image_width - sx, length);
                if (BufferSize < l)
                    l = BufferSize;
                const QRgba64 *src = op.srcFetch64(src_buffer, &op, data, sy, sx, l);
                QRgba64 *dest = op.destFetch64(buffer, data->rasterBuffer, x, spans[c].y, l);
                op.func64(dest, src, l, coverage);
                if (op.destStore64)
                    op.destStore64(data->rasterBuffer, x, spans[c].y, dest, l);
                x += l;
                sx += l;
                length -= l;
                if (sx >= image_width)
                    sx = 0;
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
}